

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editline.c
# Opt level: O0

char * search_hist(char *search,_func_char_ptr *move)

{
  int iVar1;
  int iVar2;
  size_t sVar3;
  char *pcVar4;
  _func_char_ptr *local_38;
  char *pat;
  _func_int_char_ptr_char_ptr_size_t *match;
  int pos;
  int len;
  _func_char_ptr *move_local;
  char *search_local;
  
  if ((search == (char *)0x0) || (*search == '\0')) {
    if ((old_search == (char *)0x0) || (*old_search == '\0')) {
      return (char *)0x0;
    }
    move_local = (_func_char_ptr *)old_search;
  }
  else {
    if (old_search != (char *)0x0) {
      free(old_search);
    }
    old_search = strdup(search);
    move_local = (_func_char_ptr *)search;
  }
  if (*move_local == (_func_char_ptr)0x5e) {
    pat = (char *)strncmp;
    local_38 = move_local + 1;
  }
  else {
    pat = (char *)substrcmp;
    local_38 = move_local;
  }
  sVar3 = strlen((char *)local_38);
  iVar1 = H.Pos;
  do {
    pcVar4 = (*move)();
    if (pcVar4 == (char *)0x0) {
      H.Pos = iVar1;
      return (char *)0x0;
    }
    iVar2 = (*(code *)pat)(H.Lines[H.Pos],local_38,(long)(int)sVar3);
  } while (iVar2 != 0);
  return H.Lines[H.Pos];
}

Assistant:

static const char *search_hist(const char *search, const char *(*move)(void))
{
    int         len;
    int         pos;
    int         (*match)(const char *s1, const char *s2, size_t n);
    const char *pat;

    /* Save or get remembered search pattern. */
    if (search && *search) {
        if (old_search)
            free(old_search);
        old_search = strdup(search);
    } else {
        if (old_search == NULL || *old_search == '\0')
            return NULL;
        search = old_search;
    }

    /* Set up pattern-finder. */
    if (*search == '^') {
        match = strncmp;
        pat = search + 1;
    } else {
        match = substrcmp;
        pat = search;
    }
    len = strlen(pat);

    pos = H.Pos;		/* Save H.Pos */
    while (move()) {
        if (match(H.Lines[H.Pos], pat, len) == 0)
            return H.Lines[H.Pos];
    }
    H.Pos = pos;		/* Restore H.Pos */

    return NULL;
}